

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::PolyKernel::ByteSizeLong(PolyKernel *this)

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(-(uint)(this->c_ != 0.0) & 1);
  sVar1 = uVar5 * 9 + 9;
  sVar4 = uVar5 * 9;
  if (this->gamma_ != 0.0) {
    sVar4 = sVar1;
  }
  if (NAN(this->gamma_)) {
    sVar4 = sVar1;
  }
  uVar2 = this->degree_;
  if (uVar2 != 0) {
    if ((int)uVar2 < 0) {
      uVar5 = 0xb;
    }
    else {
      iVar3 = 0x1f;
      if ((uVar2 | 1) != 0) {
        for (; (uVar2 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar5 = (ulong)((iVar3 * 9 + 0x49U >> 6) + 1);
    }
    sVar4 = sVar4 + uVar5;
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t PolyKernel::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.PolyKernel)
  size_t total_size = 0;

  // double c = 2;
  if (this->c() != 0) {
    total_size += 1 + 8;
  }

  // double gamma = 3;
  if (this->gamma() != 0) {
    total_size += 1 + 8;
  }

  // int32 degree = 1;
  if (this->degree() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->degree());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}